

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestRunSuite::Run(TestRunSuite *this)

{
  difference_type dVar1;
  Results rs;
  Test myTest2;
  Test myTest1;
  ostringstream oss;
  TestRegistry r;
  allocator local_16b1;
  string local_16b0;
  string local_1690;
  RunParams local_1670;
  Test local_1658;
  Test local_1618;
  ostringstream local_15d8 [376];
  TestRegistry local_1460;
  
  testinator::TestRegistry::TestRegistry(&local_1460);
  std::__cxx11::ostringstream::ostringstream(local_15d8);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1618
            );
  std::__cxx11::string::string((string *)&local_1658,"test1",(allocator *)&local_1690);
  std::__cxx11::string::string((string *)&local_16b0,"suite1",(allocator *)&local_1670);
  testinator::Test::Test(&local_1618,&local_1460,(string *)&local_1658,&local_16b0);
  std::__cxx11::string::~string((string *)&local_16b0);
  std::__cxx11::string::~string((string *)&local_1658);
  std::__cxx11::string::string((string *)&local_16b0,"test2",(allocator *)&local_1670);
  std::__cxx11::string::string((string *)&local_1690,"suite2",&local_16b1);
  testinator::Test::Test(&local_1658,&local_1460,&local_16b0,&local_1690);
  std::__cxx11::string::~string((string *)&local_1690);
  std::__cxx11::string::~string((string *)&local_16b0);
  std::__cxx11::string::string((string *)&local_16b0,"suite1",&local_16b1);
  local_1670.m_flags = 0;
  local_1670._4_4_ = 0;
  local_1670.m_numPropertyChecks = 100;
  local_1670.m_randomSeed = 0;
  testinator::TestRegistry::RunSuite
            ((Results *)&local_1690,&local_1460,&local_16b0,&local_1670,
             (Outputter *)local_1618._vptr_Test);
  std::__cxx11::string::~string((string *)&local_16b0);
  dVar1 = std::
          __count_if<__gnu_cxx::__normal_iterator<testinator::Result*,std::vector<testinator::Result,std::allocator<testinator::Result>>>,__gnu_cxx::__ops::_Iter_pred<TestRunSuite::Run()::_lambda(testinator::Result_const&)_1_>>
                    (local_1690._M_dataplus._M_p,local_1690._M_string_length);
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)&local_1690);
  testinator::Test::~Test(&local_1658);
  testinator::Test::~Test(&local_1618);
  if ((Outputter *)local_1618._vptr_Test != (Outputter *)0x0) {
    (*(*(_func_int ***)local_1618._vptr_Test)[8])(local_1618._vptr_Test);
  }
  std::__cxx11::ostringstream::~ostringstream(local_15d8);
  testinator::TestRegistry::~TestRegistry(&local_1460);
  return dVar1 == 1;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);

    testinator::Test myTest1(r, "test1", "suite1");
    testinator::Test myTest2(r, "test2", "suite2");
    testinator::Results rs = r.RunSuite("suite1", testinator::RunParams(), op.get());
    auto numPassed = count_if(rs.begin(), rs.end(),
                              [] (const testinator::Result& res)
                              { return res.m_success; });
    return numPassed == 1;
  }